

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * getVersion(char *aExecutable)

{
  size_t sVar1;
  FILE *__stream;
  char *__s;
  char lTestedString [1024];
  char acStack_418 [7];
  undefined4 auStack_411 [256];
  
  strcpy(acStack_418,aExecutable);
  sVar1 = strlen(acStack_418);
  builtin_strncpy(acStack_418 + sVar1," --versi",8);
  *(undefined4 *)((long)auStack_411 + sVar1) = 0x6e6f69;
  __stream = popen(acStack_418,"r");
  __s = fgets(getVersion::lBuff,0x400,__stream);
  pclose(__stream);
  sVar1 = strcspn(__s,"0123456789");
  return __s + sVar1;
}

Assistant:

static char const * getVersion( char const * const aExecutable ) /*version must be first numeral*/
{
	static char lBuff [MAX_PATH_OR_CMD] ;
	char lTestedString [MAX_PATH_OR_CMD] ;
	FILE * lIn ;
	char * lTmp ;
		
    strcpy( lTestedString , aExecutable ) ;
    strcat( lTestedString , " --version" ) ;

    lIn = popen( lTestedString , "r" ) ;
        lTmp = fgets( lBuff , sizeof( lBuff ) , lIn ) ;
        pclose( lIn ) ;
	
	lTmp += strcspn(lTmp,"0123456789");
	/* printf("lTmp:%s\n", lTmp); */
	return lTmp ;
}